

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertForCygwin.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::DoNothing::convertFileArgumentForCygwin(DoNothing *this,string *filePath)

{
  string *in_RDX;
  string *in_RDI;
  
  ::std::__cxx11::string::string((string *)in_RDI,in_RDX);
  return in_RDI;
}

Assistant:

std::string DoNothing::convertFileArgumentForCygwin(const std::string& filePath)
    {
        return filePath;
    }